

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986Segment(xmlURIPtr uri,char **str,char forbid,int empty)

{
  int iVar1;
  bool bVar2;
  char *local_30;
  char *cur;
  int empty_local;
  char forbid_local;
  char **str_local;
  xmlURIPtr uri_local;
  
  local_30 = *str;
  iVar1 = xmlIsUnreserved(uri,local_30);
  if (((iVar1 == 0) &&
      ((((*local_30 != '%' ||
         ((((local_30[1] < '0' || ('9' < local_30[1])) &&
           ((local_30[1] < 'a' || ('f' < local_30[1])))) &&
          ((local_30[1] < 'A' || ('F' < local_30[1])))))) ||
        (((local_30[2] < '0' || ('9' < local_30[2])) &&
         (((local_30[2] < 'a' || ('f' < local_30[2])) &&
          ((local_30[2] < 'A' || ('F' < local_30[2])))))))) &&
       ((((((*local_30 != '!' && (*local_30 != '$')) && (*local_30 != '&')) &&
          ((*local_30 != '(' && (*local_30 != ')')))) && (*local_30 != '*')) &&
        ((((*local_30 != '+' && (*local_30 != ',')) &&
          ((*local_30 != ';' && (((*local_30 != '=' && (*local_30 != '\'')) && (*local_30 != ':'))))
          )) && (*local_30 != '@')))))))) || (*local_30 == forbid)) {
    if (empty == 0) {
      uri_local._4_4_ = 1;
    }
    else {
      uri_local._4_4_ = 0;
    }
  }
  else {
    if (*local_30 == '%') {
      local_30 = local_30 + 3;
    }
    else {
      local_30 = local_30 + 1;
    }
    while( true ) {
      iVar1 = xmlIsUnreserved(uri,local_30);
      if (((iVar1 != 0) ||
          (((*local_30 == '%' &&
            (((('/' < local_30[1] && (local_30[1] < ':')) ||
              (('`' < local_30[1] && (local_30[1] < 'g')))) ||
             (('@' < local_30[1] && (local_30[1] < 'G')))))) &&
           ((('/' < local_30[2] && (local_30[2] < ':')) ||
            ((('`' < local_30[2] && (local_30[2] < 'g')) ||
             (('@' < local_30[2] && (local_30[2] < 'G')))))))))) ||
         (((((*local_30 == '!' || (*local_30 == '$')) || (*local_30 == '&')) ||
           ((*local_30 == '(' || (*local_30 == ')')))) ||
          ((*local_30 == '*' ||
           (((*local_30 == '+' || (*local_30 == ',')) ||
            (((*local_30 == ';' ||
              (((*local_30 == '=' || (*local_30 == '\'')) || (*local_30 == ':')))) ||
             (bVar2 = false, *local_30 == '@')))))))))) {
        bVar2 = *local_30 != forbid;
      }
      if (!bVar2) break;
      if (*local_30 == '%') {
        local_30 = local_30 + 3;
      }
      else {
        local_30 = local_30 + 1;
      }
    }
    *str = local_30;
    uri_local._4_4_ = 0;
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlParse3986Segment(xmlURIPtr uri, const char **str, char forbid, int empty)
{
    const char *cur;

    cur = *str;
    if (!ISA_PCHAR(uri, cur) || (*cur == forbid)) {
        if (empty)
	    return(0);
	return(1);
    }
    NEXT(cur);

#if defined(_WIN32) || defined(__CYGWIN__)
    /*
     * Allow Windows drive letters.
     */
    if ((forbid == ':') && (*cur == forbid))
        NEXT(cur);
#endif

    while (ISA_PCHAR(uri, cur) && (*cur != forbid))
        NEXT(cur);
    *str = cur;
    return (0);
}